

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

bool chapter2::find_elem(int pos,int *elem)

{
  ostream *poVar1;
  int iVar2;
  
  if ((uint)pos < 0x41) {
    pent_series(pos);
    iVar2 = pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(ulong)(uint)pos - 1];
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Sorry, Invalid position.");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pos);
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = 0;
  }
  *elem = iVar2;
  return (uint)pos < 0x41;
}

Assistant:

bool find_elem(int pos, int &elem) {
        if (!check_validity(pos)) {
            cerr << "Sorry, Invalid position." << pos << endl;
            elem = 0;
            return false;
        }

        const vector<int> * ptr = pent_series(pos);
        elem = (*ptr)[pos - 1];
        return true;
    }